

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_deferring_queue.h
# Opt level: O1

pair<wasm::Expression_*,_wasm::Expression_*> __thiscall
wasm::UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::pop
          (UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_> *this
          )

{
  __hashtable *__h;
  undefined1 local_30 [8];
  pair<wasm::Expression_*,_wasm::Expression_*> ret;
  __node_gen_type __node_gen;
  
  _local_30 = UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::pop
                        (&this->
                          super_UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                        );
  ret.second = (Expression *)&this->processed;
  std::
  _Hashtable<std::pair<wasm::Expression*,wasm::Expression*>,std::pair<wasm::Expression*,wasm::Expression*>,std::allocator<std::pair<wasm::Expression*,wasm::Expression*>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::Expression*,wasm::Expression*>>,std::hash<std::pair<wasm::Expression*,wasm::Expression*>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<std::pair<wasm::Expression*,wasm::Expression*>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression*,wasm::Expression*>,true>>>>
            ((_Hashtable<std::pair<wasm::Expression*,wasm::Expression*>,std::pair<wasm::Expression*,wasm::Expression*>,std::allocator<std::pair<wasm::Expression*,wasm::Expression*>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::Expression*,wasm::Expression*>>,std::hash<std::pair<wasm::Expression*,wasm::Expression*>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)ret.second,local_30);
  return _local_30;
}

Assistant:

T pop() {
    T ret = UniqueDeferredQueue<T>::pop();
    processed.insert(ret);
    return ret;
  }